

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O3

void __thiscall
google::protobuf::ServiceDescriptorProto::MergeFrom
          (ServiceDescriptorProto *this,ServiceDescriptorProto *from)

{
  uint uVar1;
  void *pvVar2;
  Rep *pRVar3;
  string *initial_value;
  string *psVar4;
  void **our_elems;
  ServiceOptions *this_00;
  int iVar5;
  Arena *pAVar6;
  ServiceOptions *from_00;
  
  pvVar2 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
           .ptr_;
  if (((ulong)pvVar2 & 1) != 0) {
    internal::InternalMetadataWithArena::DoMergeFrom
              (&this->_internal_metadata_,(UnknownFieldSet *)((ulong)pvVar2 & 0xfffffffffffffffe));
  }
  iVar5 = (from->method_).super_RepeatedPtrFieldBase.current_size_;
  if (iVar5 != 0) {
    pRVar3 = (from->method_).super_RepeatedPtrFieldBase.rep_;
    our_elems = internal::RepeatedPtrFieldBase::InternalExtend
                          (&(this->method_).super_RepeatedPtrFieldBase,iVar5);
    internal::RepeatedPtrFieldBase::
    MergeFromInnerLoop<google::protobuf::RepeatedPtrField<google::protobuf::MethodDescriptorProto>::TypeHandler>
              (&(this->method_).super_RepeatedPtrFieldBase,our_elems,pRVar3->elements,iVar5,
               ((this->method_).super_RepeatedPtrFieldBase.rep_)->allocated_size -
               (this->method_).super_RepeatedPtrFieldBase.current_size_);
    iVar5 = iVar5 + (this->method_).super_RepeatedPtrFieldBase.current_size_;
    (this->method_).super_RepeatedPtrFieldBase.current_size_ = iVar5;
    pRVar3 = (this->method_).super_RepeatedPtrFieldBase.rep_;
    if (pRVar3->allocated_size < iVar5) {
      pRVar3->allocated_size = iVar5;
    }
  }
  uVar1 = (from->_has_bits_).has_bits_[0];
  if ((uVar1 & 3) != 0) {
    if ((uVar1 & 1) != 0) {
      initial_value = (from->name_).ptr_;
      (this->_has_bits_).has_bits_[0] = (this->_has_bits_).has_bits_[0] | 1;
      pAVar6 = (Arena *)(this->_internal_metadata_).
                        super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                        .ptr_;
      if (((ulong)pAVar6 & 1) != 0) {
        pAVar6 = *(Arena **)(((ulong)pAVar6 & 0xfffffffffffffffe) + 0x18);
      }
      psVar4 = (this->name_).ptr_;
      if (psVar4 == (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
        internal::ArenaStringPtr::CreateInstance(&this->name_,pAVar6,initial_value);
      }
      else {
        std::__cxx11::string::_M_assign((string *)psVar4);
      }
    }
    if ((uVar1 & 2) != 0) {
      *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 2;
      this_00 = this->options_;
      if (this_00 == (ServiceOptions *)0x0) {
        pAVar6 = (Arena *)(this->_internal_metadata_).
                          super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                          .ptr_;
        if (((ulong)pAVar6 & 1) != 0) {
          pAVar6 = *(Arena **)(((ulong)pAVar6 & 0xfffffffffffffffe) + 0x18);
        }
        this_00 = Arena::CreateMaybeMessage<google::protobuf::ServiceOptions>(pAVar6);
        this->options_ = this_00;
      }
      from_00 = (ServiceOptions *)_ServiceOptions_default_instance_;
      if (from->options_ != (ServiceOptions *)0x0) {
        from_00 = from->options_;
      }
      ServiceOptions::MergeFrom(this_00,from_00);
      return;
    }
  }
  return;
}

Assistant:

void ServiceDescriptorProto::MergeFrom(const ServiceDescriptorProto& from) {
// @@protoc_insertion_point(class_specific_merge_from_start:google.protobuf.ServiceDescriptorProto)
  GOOGLE_DCHECK_NE(&from, this);
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  ::PROTOBUF_NAMESPACE_ID::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  method_.MergeFrom(from.method_);
  cached_has_bits = from._has_bits_[0];
  if (cached_has_bits & 0x00000003u) {
    if (cached_has_bits & 0x00000001u) {
      _internal_set_name(from._internal_name());
    }
    if (cached_has_bits & 0x00000002u) {
      _internal_mutable_options()->PROTOBUF_NAMESPACE_ID::ServiceOptions::MergeFrom(from._internal_options());
    }
  }
}